

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O0

string * __thiscall
libcellml::Variable::VariableImpl::equivalentMappingId_abi_cxx11_
          (string *__return_storage_ptr__,VariableImpl *this,VariablePtr *equivalentVariable)

{
  bool bVar1;
  mapped_type *pmVar2;
  allocator<char> local_61;
  weak_ptr<libcellml::Variable> local_60;
  _Self local_50 [3];
  weak_ptr<libcellml::Variable> local_38;
  _Self local_28;
  VariablePtr *local_20;
  VariablePtr *equivalentVariable_local;
  VariableImpl *this_local;
  
  local_20 = equivalentVariable;
  equivalentVariable_local = (VariablePtr *)this;
  this_local = (VariableImpl *)__return_storage_ptr__;
  std::weak_ptr<libcellml::Variable>::weak_ptr<libcellml::Variable,void>
            (&local_38,equivalentVariable);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::weak_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::owner_less<std::weak_ptr<libcellml::Variable>_>,_std::allocator<std::pair<const_std::weak_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(&this->mMappingIdMap,&local_38);
  local_50[0]._M_node =
       (_Base_ptr)
       std::
       map<std::weak_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::owner_less<std::weak_ptr<libcellml::Variable>_>,_std::allocator<std::pair<const_std::weak_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(&this->mMappingIdMap);
  bVar1 = std::operator!=(&local_28,local_50);
  std::weak_ptr<libcellml::Variable>::~weak_ptr(&local_38);
  if (bVar1) {
    std::weak_ptr<libcellml::Variable>::weak_ptr<libcellml::Variable,void>(&local_60,local_20);
    pmVar2 = std::
             map<std::weak_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::owner_less<std::weak_ptr<libcellml::Variable>_>,_std::allocator<std::pair<const_std::weak_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::at(&this->mMappingIdMap,&local_60);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pmVar2);
    std::weak_ptr<libcellml::Variable>::~weak_ptr(&local_60);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_61);
    std::allocator<char>::~allocator(&local_61);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Variable::VariableImpl::equivalentMappingId(const VariablePtr &equivalentVariable) const
{
    if (mMappingIdMap.find(equivalentVariable) != mMappingIdMap.end()) {
        return mMappingIdMap.at(equivalentVariable);
    }
    return "";
}